

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# var_based_part.c
# Opt level: O0

void set_vbp_thresholds_key_frame
               (AV1_COMP *cpi,int64_t *thresholds,int64_t threshold_base,int threshold_left_shift,
               int num_pixels)

{
  char cVar1;
  int shift_val;
  int shift_steps;
  int num_pixels_local;
  int threshold_left_shift_local;
  int64_t threshold_base_local;
  int64_t *thresholds_local;
  AV1_COMP *cpi_local;
  
  threshold_base_local = threshold_base;
  if ((cpi->sf).rt_sf.force_large_partition_blocks_intra != 0) {
    cVar1 = '\b';
    if ((cpi->oxcf).mode == '\x02') {
      cVar1 = '\a';
    }
    threshold_base_local = threshold_base << ((char)threshold_left_shift - cVar1 & 0x3fU);
  }
  *thresholds = threshold_base_local;
  thresholds[1] = threshold_base_local;
  if (num_pixels < 0xe1000) {
    thresholds[2] = threshold_base_local / 3;
    thresholds[3] = threshold_base_local >> 1;
  }
  else {
    shift_val._0_1_ = 2;
    if ((cpi->sf).rt_sf.force_large_partition_blocks_intra != 0) {
      shift_val._0_1_ = 0;
    }
    thresholds[2] = threshold_base_local >> (sbyte)shift_val;
    thresholds[3] = threshold_base_local >> (sbyte)shift_val;
  }
  thresholds[4] = threshold_base_local << 2;
  return;
}

Assistant:

static void set_vbp_thresholds_key_frame(AV1_COMP *cpi, int64_t thresholds[],
                                         int64_t threshold_base,
                                         int threshold_left_shift,
                                         int num_pixels) {
  if (cpi->sf.rt_sf.force_large_partition_blocks_intra) {
    const int shift_steps =
        threshold_left_shift - (cpi->oxcf.mode == ALLINTRA ? 7 : 8);
    assert(shift_steps >= 0);
    threshold_base <<= shift_steps;
  }
  thresholds[0] = threshold_base;
  thresholds[1] = threshold_base;
  if (num_pixels < RESOLUTION_720P) {
    thresholds[2] = threshold_base / 3;
    thresholds[3] = threshold_base >> 1;
  } else {
    int shift_val = 2;
    if (cpi->sf.rt_sf.force_large_partition_blocks_intra) {
      shift_val = 0;
    }

    thresholds[2] = threshold_base >> shift_val;
    thresholds[3] = threshold_base >> shift_val;
  }
  thresholds[4] = threshold_base << 2;
}